

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

matrix4x4_f32_t * prf_state_get_inverse_matrix(prf_state_t *state)

{
  float32_t *pfVar1;
  float fVar2;
  float32_t fVar3;
  undefined4 uVar4;
  uint uVar5;
  float32_t *pfVar6;
  matrix4x4_f32_t *paafVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  float32_t *pfVar16;
  ulong uVar17;
  ulong uVar18;
  float32_t *pfVar19;
  float32_t *pfVar20;
  float32_t *pfVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint auStack_38 [6];
  int p [4];
  
  if (state->inv_dirty != 0) {
    pfVar6 = (float32_t *)state->inv_matrix;
    paafVar7 = state->matrix[state->state_push_level];
    uVar8 = *(undefined8 *)(*paafVar7)[0];
    uVar9 = *(undefined8 *)((*paafVar7)[0] + 2);
    uVar10 = *(undefined8 *)(*paafVar7)[1];
    uVar11 = *(undefined8 *)((*paafVar7)[1] + 2);
    uVar12 = *(undefined8 *)(*paafVar7)[2];
    uVar13 = *(undefined8 *)((*paafVar7)[2] + 2);
    uVar14 = *(undefined8 *)((*paafVar7)[3] + 2);
    *(undefined8 *)(pfVar6 + 0xc) = *(undefined8 *)(*paafVar7)[3];
    *(undefined8 *)(pfVar6 + 0xe) = uVar14;
    *(undefined8 *)(pfVar6 + 8) = uVar12;
    *(undefined8 *)(pfVar6 + 10) = uVar13;
    *(undefined8 *)(pfVar6 + 4) = uVar10;
    *(undefined8 *)(pfVar6 + 6) = uVar11;
    *(undefined8 *)pfVar6 = uVar8;
    *(undefined8 *)(pfVar6 + 2) = uVar9;
    lVar15 = 0;
    uVar17 = 0;
    bVar23 = false;
    pfVar16 = pfVar6;
    pfVar20 = pfVar6;
    pfVar21 = pfVar6;
    do {
      auStack_38[uVar17] = 0;
      fVar25 = 0.0;
      uVar18 = uVar17;
      pfVar19 = pfVar21;
      do {
        fVar26 = 0.0;
        lVar22 = -4;
        do {
          fVar26 = fVar26 + ABS((float)pfVar19[lVar22 + 4]);
          lVar22 = lVar22 + 1;
        } while (uVar17 + lVar22 != 0);
        fVar2 = (float)pfVar6[uVar18 * 4 + uVar17];
        if (fVar25 < ABS(fVar2) / fVar26) {
          auStack_38[uVar17] = (uint)uVar18;
          fVar25 = ABS(fVar2) / fVar26;
        }
        uVar18 = uVar18 + 1;
        pfVar19 = pfVar19 + 4;
      } while (uVar18 != 4);
      if ((fVar25 == 0.0) && (!NAN(fVar25))) goto LAB_00104d7e;
      uVar5 = auStack_38[uVar17];
      if (uVar17 != uVar5) {
        lVar22 = 0;
        do {
          fVar3 = pfVar20[lVar22];
          pfVar20[lVar22] = pfVar6[(long)(int)uVar5 * 4 + lVar22];
          pfVar6[(long)(int)uVar5 * 4 + lVar22] = fVar3;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
      }
      fVar25 = (float)pfVar6[uVar17 * 5];
      uVar18 = 0;
      pfVar19 = pfVar6;
      do {
        if (uVar18 != uVar17) {
          pfVar1 = pfVar6 + uVar17 * 4 + uVar18;
          *pfVar1 = (float32_t)(-(float)*pfVar1 / fVar25);
          lVar22 = 0;
          do {
            if (lVar15 != lVar22) {
              *(float *)((long)pfVar19 + lVar22) =
                   *(float *)((long)pfVar16 + lVar22) * (float)*pfVar1 +
                   *(float *)((long)pfVar19 + lVar22);
            }
            lVar22 = lVar22 + 0x10;
          } while (lVar22 != 0x40);
        }
        uVar18 = uVar18 + 1;
        pfVar19 = pfVar19 + 1;
      } while (uVar18 != 4);
      auVar27._4_4_ = pfVar6[uVar17 + 4];
      auVar27._0_4_ = pfVar6[uVar17];
      auVar27._12_4_ = pfVar6[uVar17 + 0xc];
      auVar27._8_4_ = pfVar6[uVar17 + 8];
      auVar28._4_4_ = fVar25;
      auVar28._0_4_ = fVar25;
      auVar28._8_4_ = fVar25;
      auVar28._12_4_ = fVar25;
      auVar28 = divps(auVar27,auVar28);
      pfVar6[uVar17] = auVar28._0_4_;
      pfVar6[uVar17 + 4] = auVar28._4_4_;
      pfVar6[uVar17 + 8] = auVar28._8_4_;
      pfVar6[uVar17 + 0xc] = auVar28._12_4_;
      pfVar6[uVar17 * 5] = (float32_t)(1.0 / fVar25);
      bVar23 = 2 < uVar17;
      uVar17 = uVar17 + 1;
      pfVar21 = pfVar21 + 5;
      pfVar20 = pfVar20 + 4;
      lVar15 = lVar15 + 0x10;
      pfVar16 = pfVar16 + 1;
    } while (uVar17 != 4);
    pfVar16 = pfVar6 + 2;
    uVar17 = 2;
    do {
      uVar5 = auStack_38[uVar17];
      if (uVar17 != uVar5) {
        lVar15 = 0;
        do {
          uVar4 = *(undefined4 *)((long)pfVar16 + lVar15);
          *(undefined4 *)((long)pfVar16 + lVar15) =
               *(undefined4 *)((long)pfVar6 + lVar15 + (long)(int)uVar5 * 4);
          *(undefined4 *)((long)pfVar6 + lVar15 + (long)(int)uVar5 * 4) = uVar4;
          lVar15 = lVar15 + 0x10;
        } while (lVar15 != 0x40);
      }
      pfVar16 = pfVar16 + -1;
      bVar24 = uVar17 != 0;
      uVar17 = uVar17 - 1;
    } while (bVar24);
    state->inv_dirty = 0;
LAB_00104d7e:
    if (!bVar23) {
      return (matrix4x4_f32_t *)0x0;
    }
  }
  return state->inv_matrix;
}

Assistant:

matrix4x4_f32_t *
prf_state_get_inverse_matrix(
    prf_state_t * state )
{
    assert( state != NULL );

    if ( state->inv_dirty != FALSE ) {
        float32_t max, pivot, s, q, (*a)[4];
        int i, j, k, p[4];

        a = (float32_t (*)[4]) state->inv_matrix;
        memcpy( state->inv_matrix, state->matrix[ state->state_push_level ],
            sizeof( matrix4x4_f32_t ) ); 

        for ( k = 0; k < 4; k++ ) {
            max = 0.0f;
            p[k] = 0;
            for ( i = k; i < 4; i++ ) {
                s = 0.0;
                for ( j = k; j < 4; j++ )
                    s += (float32_t)fabs( a[i][j] );
                q = (float32_t)fabs( a[i][k] ) / s;
                if ( q > max ) {
                    max = q;
                    p[k] = i;
                }
            }
            if ( max == 0.0f )
                return NULL;
            if ( p[k] != k ) {
                for ( j = 0; j < 4; j++ ) {
                    float32_t h;
                    h = a[k][j];
                    a[k][j] = a[p[k]][j];
                    a[p[k]][j] = h;
                }
            }
            pivot = a[k][k];
            for ( j = 0; j < 4; j++ ) {
                if ( j != k ) {
                    a[k][j] = - a[k][j] / pivot;
                    for ( i = 0; i < 4; i++ )
                        if ( i != k )
                            a[i][j] += a[i][k] * a[k][j];
                }
            }
            for ( i = 0; i < 4; i++ )
                a[i][k] /= pivot;
            a[k][k] = 1 / pivot;
        }
        for ( k = 4 - 2; k >= 0; k-- ) {
            if ( p[k] != k ) {
                for ( i = 0; i < 4; i++ ) {
                    float32_t h;
                    h = a[i][k];
                    a[i][k] = a[i][p[k]];
                    a[i][p[k]] = h;
                }
            }
        }
        state->inv_dirty = FALSE;
    }

    return state->inv_matrix;
}